

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O3

compile_errcode __thiscall ReturnStatement::Parse(ReturnStatement *this)

{
  LogTools *log_tools_ptr;
  SymbolName SVar1;
  compile_errcode cVar2;
  char *pcVar3;
  undefined4 uVar4;
  char *pcVar5;
  string local_48;
  
  uVar4 = 0;
LAB_0012b275:
  SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
  switch(uVar4) {
  case 0:
    uVar4 = 1;
    if (SVar1 != RETURN_SYM) {
      return -1;
    }
    break;
  case 1:
    uVar4 = 2;
    if (SVar1 != L_CIRCLE_BRACKET_SYM) {
      if (SVar1 == SEMICOLON_SYM) {
        return 0;
      }
      pcVar5 = "expected a \'(\' or \';\'";
      pcVar3 = "";
LAB_0012b347:
      log_tools_ptr = g_log_tools;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,pcVar5,pcVar3);
      GrammaErrorLogs(log_tools_ptr,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      return -1;
    }
    break;
  case 2:
    cVar2 = Expression::Parse(&this->m_expression);
    if (cVar2 != 0) {
      pcVar5 = "expected a valid expression in return statement";
      pcVar3 = "";
      goto LAB_0012b347;
    }
    Expression::LogOutput(&this->m_expression);
    uVar4 = 3;
    goto LAB_0012b275;
  case 3:
    uVar4 = 4;
    if (SVar1 != R_CIRCLE_BRACKET_SYM) {
      pcVar5 = "expected a \')\'";
      pcVar3 = "";
      goto LAB_0012b347;
    }
    break;
  case 4:
    goto switchD_0012b28b_caseD_4;
  }
  SymbolQueue::NextSymbol(handle_symbol_queue);
  goto LAB_0012b275;
switchD_0012b28b_caseD_4:
  return 0;
}

Assistant:

compile_errcode ReturnStatement::Parse() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == RETURN_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    return COMPILE_OK;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a '(' or ';'");
                    return NOT_MATCH;
                }
            }
            case 2: {
                if ((ret = m_expression.Parse()) == COMPILE_OK) {
                    state = 3;
                    m_expression.LogOutput();
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid expression in return statement");
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ')'");
                    return NOT_MATCH;
                }
            }
            case 4: return COMPILE_OK;
        }
        if (state != 3)
            handle_symbol_queue->NextSymbol();
    }
}